

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# czmap.c
# Opt level: O0

void czmap_destroy(czmap *map,czdestroyfunc func)

{
  czdestroyfunc func_local;
  czmap *map_local;
  
  if (map->left != (czmap *)0x0) {
    czmap_destroy(map->left,func);
  }
  if (map->right != (czmap *)0x0) {
    czmap_destroy(map->right,func);
  }
  if (func != (czdestroyfunc)0x0) {
    (*func)(map->data);
  }
  czmap_internal_free(map);
  return;
}

Assistant:

void czmap_destroy(czmap * map, czdestroyfunc func)  {
    if (map->left != NULL)
        czmap_destroy(map->left, func);
    if (map->right != NULL)
        czmap_destroy(map->right, func);
    if (func != NULL)
        func(map->data);
    czmap_internal_free(map);
}